

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O3

void __thiscall
Annotator_hashChangesAndUpdates_Test::~Annotator_hashChangesAndUpdates_Test
          (Annotator_hashChangesAndUpdates_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Annotator, hashChangesAndUpdates)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(modelStringUniqueIds);
    auto annotator = libcellml::Annotator::create();

    EXPECT_FALSE(annotator->hasModel());

    // Model is set and the identifier map is not created.
    annotator->setModel(model);

    // Can set identifier manually, this does not trigger a rebuild of the identifier map.
    model->setId("iHaveChanged");

    // The identifier map is built when a query is made.
    EXPECT_EQ(nullptr, annotator->model("model_1"));

    // Can set identifier automatically, this does not trigger a rebuild of the identifier map.
    EXPECT_EQ("b4da55", annotator->assignId(model->component(0)));

    EXPECT_NE(nullptr, annotator->encapsulation("encapsulation_1"));
}